

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.h
# Opt level: O2

void __thiscall
rest_rpc::rpc_service::connection::publish(connection *this,string *key,string *data)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string result;
  string local_30;
  
  msgpack_codec::
  pack_args_str<rest_rpc::result_code,std::__cxx11::string_const&,std::__cxx11::string_const&,void>
            (&result,(msgpack_codec *)0x0,(result_code)key,data,in_R8);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result._M_dataplus._M_p == &result.field_2) {
    local_30.field_2._8_8_ = result.field_2._8_8_;
  }
  else {
    local_30._M_dataplus._M_p = result._M_dataplus._M_p;
  }
  local_30._M_string_length = result._M_string_length;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  result._M_dataplus._M_p = (pointer)&result.field_2;
  response(this,0,&local_30,sub_pub);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&result);
  return;
}

Assistant:

void publish(const std::string &key, const std::string &data) {
    auto result = msgpack_codec::pack_args_str(result_code::OK, key, data);
    response(0, std::move(result), request_type::sub_pub);
  }